

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  UnitTestImpl *this_00;
  UnitTest *this_01;
  String *in_RDI;
  String *in_stack_000000b8;
  String *in_stack_000000c0;
  int in_stack_000000cc;
  char *in_stack_000000d0;
  Type in_stack_000000dc;
  UnitTest *in_stack_000000e0;
  Message *in_stack_ffffffffffffffe0;
  String *in_stack_ffffffffffffffe8;
  
  this_00 = (UnitTestImpl *)UnitTest::GetInstance();
  AppendUserMessage(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  this_01 = UnitTest::GetInstance();
  UnitTest::impl(this_01);
  UnitTestImpl::CurrentOsStackTraceExceptTop(this_00,(int)((ulong)in_RDI >> 0x20));
  UnitTest::AddTestPartResult
            (in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000cc,
             in_stack_000000c0,in_stack_000000b8);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->
    AddTestPartResult(data_->type, data_->file, data_->line,
                      AppendUserMessage(data_->message, message),
                      UnitTest::GetInstance()->impl()
                      ->CurrentOsStackTraceExceptTop(1)
                      // Skips the stack frame for this function itself.
                      );  // NOLINT
}